

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_write_block_scalar_hints(yaml_emitter_t *emitter,yaml_string_t string)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  char *indicator;
  char indent_hint [2];
  undefined8 uStack_18;
  
  bVar1 = *string.pointer;
  if ((((ulong)bVar1 < 0x21) && ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
     ((uStack_18 = in_RAX, bVar1 != 0xe2 && ((bVar1 == 0xc2 && (string.pointer[1] == 0x85)))))) {
    uStack_18 = (ulong)CONCAT16((char)emitter->best_indent + '0',(int6)in_RAX);
    iVar2 = yaml_emitter_write_indicator(emitter,(char *)((long)&uStack_18 + 6),0,0,0);
    if (iVar2 == 0) {
      return 0;
    }
  }
  emitter->open_ended = 0;
  indicator = "-";
  if (string.start != string.end) {
    bVar1 = string.end[-1];
    if (bVar1 < 0xc2) {
      if ((bVar1 != 10) && (bVar1 != 0xd)) goto LAB_0010a53d;
    }
    else if (((bVar1 == 0xe2) || (bVar1 != 0xc2)) || (*string.end != 0x85)) goto LAB_0010a53d;
    if (string.end + -1 != string.start) {
      bVar1 = string.end[-2];
      if (bVar1 < 0xc2) {
        if ((bVar1 != 10) && (bVar1 != 0xd)) {
          return 1;
        }
      }
      else {
        if (bVar1 == 0xe2) {
          return 1;
        }
        if (bVar1 != 0xc2) {
          return 1;
        }
        if (string.end[-1] != 0x85) {
          return 1;
        }
      }
    }
    emitter->open_ended = 1;
    indicator = "+";
  }
LAB_0010a53d:
  iVar2 = yaml_emitter_write_indicator(emitter,indicator,0,0,0);
  if (iVar2 != 0) {
    return 1;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_write_block_scalar_hints(yaml_emitter_t *emitter,
        yaml_string_t string)
{
    char indent_hint[2];
    const char *chomp_hint = NULL;

    if (IS_SPACE(string) || IS_BREAK(string))
    {
        indent_hint[0] = '0' + (char)emitter->best_indent;
        indent_hint[1] = '\0';
        if (!yaml_emitter_write_indicator(emitter, indent_hint, 0, 0, 0))
            return 0;
    }

    emitter->open_ended = 0;

    string.pointer = string.end;
    if (string.start == string.pointer)
    {
        chomp_hint = "-";
    }
    else
    {
        do {
            string.pointer --;
        } while ((*string.pointer & 0xC0) == 0x80);
        if (!IS_BREAK(string))
        {
            chomp_hint = "-";
        }
        else if (string.start == string.pointer)
        {
            chomp_hint = "+";
            emitter->open_ended = 1;
        }
        else
        {
            do {
                string.pointer --;
            } while ((*string.pointer & 0xC0) == 0x80);
            if (IS_BREAK(string))
            {
                chomp_hint = "+";
                emitter->open_ended = 1;
            }
        }
    }

    if (chomp_hint)
    {
        if (!yaml_emitter_write_indicator(emitter, chomp_hint, 0, 0, 0))
            return 0;
    }

    return 1;
}